

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O1

int av1_cost_coeffs_txb_laplacian
              (MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type,TXB_CTX *txb_ctx,
              int reduced_tx_set_used,int adjust_eob)

{
  TX_CLASS tx_class;
  char cVar1;
  ushort uVar2;
  int16_t *piVar3;
  tran_low_t *ptVar4;
  tran_low_t *ptVar5;
  tran_low_t *ptVar6;
  short *psVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  LV_MAP_COEFF_COST *txb_costs;
  long lVar16;
  MACROBLOCK *x_00;
  long lVar17;
  int eob_out;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  int local_50 [2];
  TXB_CTX *local_48;
  MACROBLOCK *local_40;
  ulong local_38;
  
  uVar2 = x->plane[plane].eobs[block];
  uVar13 = (ulong)uVar2;
  uVar18 = (uint)uVar2;
  local_38 = (ulong)tx_type;
  x_00 = x;
  if (adjust_eob != 0) {
    piVar3 = av1_scan_orders[tx_size][tx_type].scan;
    lVar20 = (long)(block << 4);
    ptVar4 = x->plane[plane].coeff;
    ptVar5 = x->plane[plane].qcoeff;
    ptVar6 = x->plane[plane].dqcoeff;
    local_48 = txb_ctx;
    local_40 = x;
    iVar10 = av1_get_tx_scale(tx_size);
    psVar7 = x->plane[plane].dequant_QTX;
    iVar15 = (int)*psVar7;
    local_50[0] = (iVar15 * 0x46 + 0x40 >> 7) + iVar15;
    iVar15 = (int)psVar7[1];
    local_50[1] = (iVar15 * 0x46 + 0x40 >> 7) + iVar15;
    uVar19 = uVar13;
    do {
      uVar18 = (uint)uVar19;
      if ((long)uVar13 < 1) break;
      lVar16 = (long)piVar3[uVar13 - 1];
      uVar14 = ptVar4[lVar20 + lVar16];
      uVar8 = -uVar14;
      if (0 < (int)uVar14) {
        uVar8 = uVar14;
      }
      bVar22 = (long)((ulong)uVar8 << ((char)iVar10 + 1U & 0x3f)) < (long)local_50[lVar16 != 0];
      bVar21 = ptVar5[lVar20 + lVar16] == 0;
      if (bVar21 || bVar22) {
        uVar19 = (ulong)(uVar18 - 1);
        ptVar5[lVar20 + lVar16] = 0;
        ptVar6[lVar20 + lVar16] = 0;
      }
      uVar18 = (uint)uVar19;
      uVar13 = uVar13 - 1;
    } while (bVar21 || bVar22);
    x->plane[plane].eobs[block] = (uint16_t)uVar18;
    x_00 = local_40;
    txb_ctx = local_48;
  }
  uVar14 = (uint)""[tx_size] + (uint)""[tx_size] + 1 >> 1 & 0xff;
  bVar22 = plane != 0;
  txb_costs = (x_00->coeff_costs).coeff_costs[uVar14] + bVar22;
  if (uVar18 == 0) {
    iVar10 = (x_00->coeff_costs).coeff_costs[uVar14][bVar22].txb_skip_cost[txb_ctx->txb_skip_ctx][1]
    ;
  }
  else {
    tx_class = ""[local_38];
    cVar1 = ""[tx_size];
    iVar15 = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][0];
    iVar10 = (int)local_38;
    iVar11 = get_tx_type_cost(x_00,&x_00->e_mbd,plane,tx_size,(TX_TYPE)local_38,reduced_tx_set_used)
    ;
    iVar12 = get_eob_cost(uVar18,(x_00->coeff_costs).eob_costs[cVar1] + bVar22,txb_costs,tx_class);
    lVar20 = *(long *)((long)&av1_scan_orders[tx_size][0].scan + (ulong)(uint)(iVar10 << 4));
    ptVar4 = x->plane[plane].qcoeff;
    uVar2 = x->plane[plane].eobs[block];
    iVar10 = ptVar4[(long)(block << 4) + (long)*(short *)(lVar20 + -2 + (ulong)uVar2 * 2)];
    iVar9 = -iVar10;
    if (0 < iVar10) {
      iVar9 = iVar10;
    }
    iVar10 = iVar9 * 0x800 + -0x800;
    if (1 < uVar2) {
      lVar16 = (ulong)(uVar2 - 2) + 1;
      do {
        uVar18 = ptVar4[(long)(block << 4) + (long)*(short *)(lVar20 + -2 + lVar16 * 2)];
        uVar14 = -uVar18;
        if (0 < (int)uVar18) {
          uVar14 = uVar18;
        }
        uVar13 = (ulong)uVar14;
        if (0xd < uVar14) {
          uVar13 = 0xe;
        }
        iVar10 = iVar10 + costLUT[uVar13];
        lVar17 = lVar16 + -1;
        bVar22 = 0 < lVar16;
        lVar16 = lVar17;
      } while (lVar17 != 0 && bVar22);
    }
    iVar10 = iVar11 + iVar15 + iVar12 + (uVar2 - 1) * 0x4e3 + iVar10;
  }
  return iVar10;
}

Assistant:

int av1_cost_coeffs_txb_laplacian(const MACROBLOCK *x, const int plane,
                                  const int block, const TX_SIZE tx_size,
                                  const TX_TYPE tx_type,
                                  const TXB_CTX *const txb_ctx,
                                  const int reduced_tx_set_used,
                                  const int adjust_eob) {
  const struct macroblock_plane *p = &x->plane[plane];
  int eob = p->eobs[block];

  if (adjust_eob) {
    const SCAN_ORDER *scan_order = get_scan(tx_size, tx_type);
    const int16_t *scan = scan_order->scan;
    tran_low_t *tcoeff = p->coeff + BLOCK_OFFSET(block);
    tran_low_t *qcoeff = p->qcoeff + BLOCK_OFFSET(block);
    tran_low_t *dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);
    update_coeff_eob_fast(&eob, av1_get_tx_scale(tx_size), p->dequant_QTX, scan,
                          tcoeff, qcoeff, dqcoeff);
    p->eobs[block] = eob;
  }

  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const LV_MAP_COEFF_COST *const coeff_costs =
      &x->coeff_costs.coeff_costs[txs_ctx][plane_type];
  if (eob == 0) {
    return coeff_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  }

  const MACROBLOCKD *const xd = &x->e_mbd;
  const TX_CLASS tx_class = tx_type_to_class[tx_type];

  return warehouse_efficients_txb_laplacian(
      x, plane, block, tx_size, txb_ctx, eob, plane_type, coeff_costs, xd,
      tx_type, tx_class, reduced_tx_set_used);
}